

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tables.cpp
# Opt level: O0

void __thiscall CMacroTable::Add(CMacroTable *this,char *nnaam,char **p)

{
  bool bVar1;
  int iVar2;
  char *searchString;
  CStringsList *this_00;
  pointer ppVar3;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CMacroTableEntry>_>,_bool>
  pVar4;
  CStringsList *argname;
  char *n;
  CStringsList *last;
  type *local_98;
  type *is_new;
  type *add_it;
  undefined1 local_80;
  CMacroTableEntry local_78 [2];
  allocator<char> local_51;
  key_type local_50;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CMacroTableEntry>_>,_bool>
  local_30;
  char **local_20;
  char **p_local;
  char *nnaam_local;
  CMacroTable *this_local;
  
  local_20 = p;
  p_local = (char **)nnaam;
  nnaam_local = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,nnaam,&local_51);
  local_78[0].args = (CStringsList *)0x0;
  local_78[0].body = (CStringsList *)0x0;
  CMacroTableEntry::CMacroTableEntry(local_78);
  pVar4 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CMacroTableEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CMacroTableEntry>_>_>
          ::try_emplace<CMacroTableEntry>(&this->macs,&local_50,local_78);
  add_it = (type *)pVar4.first._M_node;
  local_80 = pVar4.second;
  local_30.first._M_node = (_Base_ptr)add_it;
  local_30.second = (bool)local_80;
  CMacroTableEntry::~CMacroTableEntry(local_78);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  is_new = (type *)std::
                   get<0ul,std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,CMacroTableEntry>>,bool>
                             (&local_30);
  local_98 = std::
             get<1ul,std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,CMacroTableEntry>>,bool>
                       (&local_30);
  if ((*local_98 & 1U) == 0) {
    Error("Duplicate macroname",(char *)p_local,PASS3);
  }
  else {
    _last = std::vector<bool,_std::allocator<bool>_>::operator[]
                      (&this->used,(long)(int)((int)*(char *)p_local & 0x7f));
    std::_Bit_reference::operator=((_Bit_reference *)&last,true);
    n = (char *)0x0;
    do {
      searchString = GetID(local_20);
      if (searchString == (char *)0x0) {
        if ((pass == 1) && ((n != (char *)0x0 || (**local_20 != '\0')))) {
          Error("Illegal argument name",*local_20,EARLY);
        }
        SkipToEol(local_20);
        break;
      }
      if (pass == 1) {
        ppVar3 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CMacroTableEntry>_>
                 ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CMacroTableEntry>_>
                               *)is_new);
        bVar1 = CStringsList::contains((ppVar3->second).args,searchString);
        if (bVar1) {
          Error("Duplicate argument name",searchString,EARLY);
        }
      }
      this_00 = (CStringsList *)operator_new(0x28);
      CStringsList::CStringsList(this_00,searchString,(CStringsList *)0x0);
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CMacroTableEntry>_>
               ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CMacroTableEntry>_>
                             *)is_new);
      if ((ppVar3->second).args == (CStringsList *)0x0) {
        ppVar3 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CMacroTableEntry>_>
                 ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CMacroTableEntry>_>
                               *)is_new);
        (ppVar3->second).args = this_00;
      }
      else {
        *(CStringsList **)(n + 8) = this_00;
      }
      bVar1 = anyComma(local_20);
      n = (char *)this_00;
    } while (bVar1);
    if ((pass == 1) && (**local_20 != '\0')) {
      Error("Unexpected",*local_20,EARLY);
    }
    ListFile(false);
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CMacroTableEntry>_>
             ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CMacroTableEntry>_>
                           *)is_new);
    iVar2 = ReadFileToCStringsList(&(ppVar3->second).body,"endm");
    if (iVar2 == 0) {
      Error("Unexpected end of macro",(char *)0x0,EARLY);
    }
  }
  return;
}

Assistant:

void CMacroTable::Add(const char* nnaam, char*& p) {
	auto [add_it, is_new] = macs.try_emplace(nnaam, CMacroTableEntry());
	if (!is_new) {
		Error("Duplicate macroname", nnaam);
		return;
	}
	used[nnaam[0] & 127] = true;
	CStringsList* last = nullptr;
	do {
		char* n = GetID(p);
		if (!n) {
			// either EOL when no previous argument, or valid name is required after comma (2nd+ loop)
			if ((1 == pass) && (last || *p)) Error("Illegal argument name", p, EARLY);
			SkipToEol(p);
			break;
		}
		if ((1 == pass) && CStringsList::contains(add_it->second.args, n)) {
			Error("Duplicate argument name", n, EARLY);
		}
		CStringsList* argname = new CStringsList(n);
		if (!add_it->second.args) {
			add_it->second.args = argname;	// first argument name, make it head of list
		} else {
			last->next = argname;
		}
		last = argname;
	} while (anyComma(p));
	if ((1 == pass) && *p) {
		Error("Unexpected", p, EARLY);
	}
	ListFile();
	if (!ReadFileToCStringsList(add_it->second.body, "endm")) {
		Error("Unexpected end of macro", NULL, EARLY);
	}
}